

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_proc ma_dlsym(ma_context *pContext,ma_handle handle,char *symbol)

{
  ma_proc p_Var1;
  ma_log *pmVar2;
  
  if (pContext == (ma_context *)0x0) {
    pmVar2 = (ma_log *)0x0;
  }
  else {
    pmVar2 = pContext->pLog;
  }
  ma_log_postf(pmVar2,4,"Loading symbol: %s\n",symbol);
  p_Var1 = (ma_proc)dlsym(handle,symbol);
  if (p_Var1 == (ma_proc)0x0) {
    if (pContext == (ma_context *)0x0) {
      pmVar2 = (ma_log *)0x0;
    }
    else {
      pmVar2 = pContext->pLog;
    }
    ma_log_postf(pmVar2,2,"Failed to load symbol: %s\n",symbol);
  }
  return p_Var1;
}

Assistant:

MA_API ma_proc ma_dlsym(ma_context* pContext, ma_handle handle, const char* symbol)
{
    ma_proc proc;

    ma_log_postf(ma_context_get_log(pContext), MA_LOG_LEVEL_DEBUG, "Loading symbol: %s\n", symbol);

#ifdef _WIN32
    proc = (ma_proc)GetProcAddress((HMODULE)handle, symbol);
#else
#if defined(__GNUC__) && (__GNUC__ > 4 || (__GNUC__ == 4 && __GNUC_MINOR__ >= 8))
    #pragma GCC diagnostic push
    #pragma GCC diagnostic ignored "-Wpedantic"
#endif
    proc = (ma_proc)dlsym((void*)handle, symbol);
#if defined(__GNUC__) && (__GNUC__ > 4 || (__GNUC__ == 4 && __GNUC_MINOR__ >= 8))
    #pragma GCC diagnostic pop
#endif
#endif

    if (proc == NULL) {
        ma_log_postf(ma_context_get_log(pContext), MA_LOG_LEVEL_WARNING, "Failed to load symbol: %s\n", symbol);
    }

    (void)pContext; /* It's possible for pContext to be unused. */
    return proc;
}